

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

void __thiscall
internalJSONNode::internalJSONNode(internalJSONNode *this,json_string *name_t,json_string *value_t)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  size_t *psVar7;
  jsonChildren *this_00;
  json_string *pjVar8;
  internalJSONNode *piVar9;
  allocator local_71;
  json_string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_type = '\0';
  piVar9 = (internalJSONNode *)&this->_name;
  JSONWorker::FixString((json_string *)piVar9,name_t,&this->_name_encoded);
  this->_name_encoded = false;
  (this->_string)._M_dataplus._M_p = (pointer)&(this->_string).field_2;
  (this->_string)._M_string_length = 0;
  (this->_string).field_2._M_local_buf[0] = '\0';
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = false;
  if (jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single == '\0') {
    internalJSONNode(piVar9);
  }
  piVar9 = (internalJSONNode *)&this->_string;
  (this->_comment)._M_dataplus._M_p = (pointer)&(this->_comment).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_comment,jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single
             ,DAT_001274a8 + jsonSingletonEMPTY_JSON_STRING::getValue[abi:cxx11]()::single);
  this->Children = (jsonChildren *)0x0;
  psVar7 = getCtorCounter();
  *psVar7 = *psVar7 + 1;
  if (value_t->_M_string_length == 0) {
LAB_00117b79:
    this->_type = '\0';
LAB_00117b7c:
    this->fetched = true;
    return;
  }
  std::__cxx11::string::_M_assign((string *)piVar9);
  pbVar3 = (byte *)(value_t->_M_dataplus)._M_p;
  bVar1 = *pbVar3;
  bVar2 = pbVar3[value_t->_M_string_length - 1];
  if (bVar1 < 0x5b) {
    if (0x4d < bVar1) {
      if (bVar1 == 0x4e) goto LAB_00117b45;
      if (bVar1 == 0x54) goto LAB_00117aaa;
LAB_00117c81:
      bVar5 = NumberToString::isNumeric(value_t);
      if (bVar5) {
        this->_type = '\x02';
LAB_00117c6e:
        this->fetched = false;
        return;
      }
      pjVar8 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
      std::operator+(&local_50,pjVar8,value_t);
      std::__cxx11::string::string((string *)&local_70,local_50._M_dataplus._M_p,&local_71);
      goto LAB_00117c04;
    }
    if (bVar1 != 0x22) {
      if (bVar1 == 0x46) goto LAB_00117b08;
      goto LAB_00117c81;
    }
    if (bVar2 == 0x22) {
      this->_type = '\x01';
      goto LAB_00117c6e;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unterminated quote","");
LAB_00117cfd:
    JSONDebug::_JSON_FAIL(&local_70);
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00117c36;
  }
  else {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        if (bVar2 != 0x5d) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Missing ]","");
          goto LAB_00117cfd;
        }
        this->_type = '\x04';
        this_00 = (jsonChildren *)operator_new(0x10);
LAB_00117c5c:
        jsonChildren::jsonChildren(this_00);
        this->Children = this_00;
        goto LAB_00117c6e;
      }
      if (bVar1 != 0x66) goto LAB_00117c81;
LAB_00117b08:
      if (jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single == '\0') {
        internalJSONNode(piVar9);
      }
      sVar4 = value_t->_M_string_length;
      if ((sVar4 == DAT_00127658) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp((value_t->_M_dataplus)._M_p,
                        jsonSingletonCONST_FALSE::getValue[abi:cxx11]()::single,sVar4), iVar6 == 0))
         )) {
        (this->_value)._bool = false;
        this->_type = '\x03';
        goto LAB_00117b7c;
      }
      pjVar8 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
      std::operator+(&local_50,pjVar8,value_t);
      std::__cxx11::string::string((string *)&local_70,local_50._M_dataplus._M_p,&local_71);
    }
    else if (bVar1 == 0x6e) {
LAB_00117b45:
      if (jsonSingletonCONST_NULL::getValue[abi:cxx11]()::single == '\0') {
        internalJSONNode(piVar9);
      }
      sVar4 = value_t->_M_string_length;
      if ((sVar4 == DAT_00127680) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp((value_t->_M_dataplus)._M_p,
                        jsonSingletonCONST_NULL::getValue[abi:cxx11]()::single,sVar4), iVar6 == 0)))
         ) goto LAB_00117b79;
      pjVar8 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
      std::operator+(&local_50,pjVar8,value_t);
      std::__cxx11::string::string((string *)&local_70,local_50._M_dataplus._M_p,&local_71);
    }
    else {
      if (bVar1 != 0x74) {
        if (bVar1 != 0x7b) goto LAB_00117c81;
        if (bVar2 != 0x7d) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Missing }","");
          goto LAB_00117cfd;
        }
        this->_type = '\x05';
        this_00 = (jsonChildren *)operator_new(0x10);
        goto LAB_00117c5c;
      }
LAB_00117aaa:
      if (jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single == '\0') {
        internalJSONNode(piVar9);
      }
      sVar4 = value_t->_M_string_length;
      if ((sVar4 == DAT_00127608) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp((value_t->_M_dataplus)._M_p,
                        jsonSingletonCONST_TRUE::getValue[abi:cxx11]()::single,sVar4), iVar6 == 0)))
         ) {
        (this->_value)._bool = true;
        this->_type = '\x03';
        this->fetched = true;
        return;
      }
      pjVar8 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
      std::operator+(&local_50,pjVar8,value_t);
      std::__cxx11::string::string((string *)&local_70,local_50._M_dataplus._M_p,&local_71);
    }
LAB_00117c04:
    JSONDebug::_JSON_FAIL(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00117c36;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_00117c36:
  Nullify(this);
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const json_string & name_t, const json_string & value_t) json_nothrow : _type(), _name_encoded(), _name(JSONWorker::FixString(name_t, NAME_ENCODED)), _string(), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(false)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren(0){

    LIBJSON_CTOR;

    #ifdef JSON_STRICT
	   JSON_ASSERT_SAFE(!value_t.empty(), JSON_TEXT("empty node"), Nullify(); return;);
    #else 
	   if (json_unlikely(value_t.empty())){
		  _type = JSON_NULL;
		  SetFetched(true);
		  return;
	   }
    #endif

    _string = value_t;

    const json_char firstchar = value_t[0];
    #if defined JSON_DEBUG || defined JSON_SAFE
	   const json_char lastchar = value_t[value_t.length() - 1];
    #endif

    switch (firstchar){
        case JSON_TEXT('\"'):  //a json_string literal, still escaped and with leading and trailing quotes
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('\"'), JSON_TEXT("Unterminated quote"), Nullify(); return;);
            _type = JSON_STRING;
			SetFetchedFalseOrDo(FetchString());
            break;
        case JSON_TEXT('{'):  //a child node, or set of children
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('}'), JSON_TEXT("Missing }"), Nullify(); return;);
            _type = JSON_NODE;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchNode());
            break;
        case JSON_TEXT('['):  //an array
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT(']'), JSON_TEXT("Missing ]"), Nullify(); return;);
            _type = JSON_ARRAY;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchArray());
            break;
        LETTERCASE('t', 'T'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_TRUE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = true;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('f', 'F'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_FALSE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = false;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('n', 'N'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_NULL), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _type = JSON_NULL;
			SetFetched(true);
            break;
        default:
            JSON_ASSERT_SAFE(NumberToString::isNumeric(value_t), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
			_type = JSON_NUMBER;
			SetFetchedFalseOrDo(FetchNumber());
            break;
    }
}